

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uvprims.c
# Opt level: O0

sexp_conflict
sexp_init_library(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict env,char *version
                 ,char *abi)

{
  undefined8 uVar1;
  long lVar2;
  int iVar3;
  undefined8 uVar4;
  int *piVar5;
  undefined8 in_RCX;
  long in_RDI;
  char *in_R8;
  char *in_R9;
  sexp_gc_var_t __sexp_gc_preserver3;
  sexp_conflict op;
  sexp_gc_var_t __sexp_gc_preserver2;
  sexp_conflict tmp;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp_conflict name;
  int **local_80;
  undefined8 local_78;
  int *local_70;
  undefined8 *local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 *local_50;
  undefined8 local_48;
  undefined8 local_40;
  char *local_38;
  char *local_30;
  undefined8 local_28;
  long local_10;
  
  local_40 = 0x43e;
  local_38 = in_R9;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_10 = in_RDI;
  memset(&local_50,0,0x10);
  local_58 = 0x43e;
  memset(&local_68,0,0x10);
  local_70 = (int *)0x43e;
  memset(&local_80,0,0x10);
  iVar3 = strcmp(local_30,"0.11.0");
  if ((iVar3 == 0) && (iVar3 = strncmp(local_38,"cv-gm*uh",8), iVar3 == 0)) {
    local_50 = &local_40;
    local_48 = *(undefined8 *)(local_10 + 0x6080);
    *(undefined8 ***)(local_10 + 0x6080) = &local_50;
    local_68 = &local_58;
    local_60 = *(undefined8 *)(local_10 + 0x6080);
    *(undefined8 ***)(local_10 + 0x6080) = &local_68;
    local_80 = &local_70;
    local_78 = *(undefined8 *)(local_10 + 0x6080);
    *(int ****)(local_10 + 0x6080) = &local_80;
    uVar4 = sexp_intern(local_10,"SEXP_F16");
    lVar2 = local_10;
    uVar1 = local_28;
    local_40 = uVar4;
    local_58 = sexp_make_integer(local_10,0xf,0);
    sexp_env_define(lVar2,uVar1,uVar4);
    uVar4 = sexp_intern(local_10,"SEXP_F8");
    lVar2 = local_10;
    uVar1 = local_28;
    local_40 = uVar4;
    local_58 = sexp_make_integer(local_10,0xe,0);
    sexp_env_define(lVar2,uVar1,uVar4);
    uVar4 = sexp_intern(local_10,"SEXP_C128",9);
    lVar2 = local_10;
    uVar1 = local_28;
    local_40 = uVar4;
    local_58 = sexp_make_integer(local_10,0xd,0);
    sexp_env_define(lVar2,uVar1,uVar4);
    uVar4 = sexp_intern(local_10,"SEXP_C64",8);
    lVar2 = local_10;
    uVar1 = local_28;
    local_40 = uVar4;
    local_58 = sexp_make_integer(local_10,0xc,0);
    sexp_env_define(lVar2,uVar1,uVar4);
    uVar4 = sexp_intern(local_10,"SEXP_F64",8);
    lVar2 = local_10;
    uVar1 = local_28;
    local_40 = uVar4;
    local_58 = sexp_make_integer(local_10,0xb,0);
    sexp_env_define(lVar2,uVar1,uVar4);
    uVar4 = sexp_intern(local_10,"SEXP_F32",8);
    lVar2 = local_10;
    uVar1 = local_28;
    local_40 = uVar4;
    local_58 = sexp_make_integer(local_10,10,0);
    sexp_env_define(lVar2,uVar1,uVar4);
    uVar4 = sexp_intern(local_10,"SEXP_U64",8);
    lVar2 = local_10;
    uVar1 = local_28;
    local_40 = uVar4;
    local_58 = sexp_make_integer(local_10,9,0);
    sexp_env_define(lVar2,uVar1,uVar4);
    uVar4 = sexp_intern(local_10,"SEXP_S64",8);
    lVar2 = local_10;
    uVar1 = local_28;
    local_40 = uVar4;
    local_58 = sexp_make_integer(local_10,8,0);
    sexp_env_define(lVar2,uVar1,uVar4);
    uVar4 = sexp_intern(local_10,"SEXP_U32",8);
    lVar2 = local_10;
    uVar1 = local_28;
    local_40 = uVar4;
    local_58 = sexp_make_integer(local_10,7,0);
    sexp_env_define(lVar2,uVar1,uVar4);
    uVar4 = sexp_intern(local_10,"SEXP_S32",8);
    lVar2 = local_10;
    uVar1 = local_28;
    local_40 = uVar4;
    local_58 = sexp_make_integer(local_10,6,0);
    sexp_env_define(lVar2,uVar1,uVar4);
    uVar4 = sexp_intern(local_10,"SEXP_U16",8);
    lVar2 = local_10;
    uVar1 = local_28;
    local_40 = uVar4;
    local_58 = sexp_make_integer(local_10,5,0);
    sexp_env_define(lVar2,uVar1,uVar4);
    uVar4 = sexp_intern(local_10,"SEXP_S16",8);
    lVar2 = local_10;
    uVar1 = local_28;
    local_40 = uVar4;
    local_58 = sexp_make_integer(local_10,4,0);
    sexp_env_define(lVar2,uVar1,uVar4);
    uVar4 = sexp_intern(local_10,"SEXP_U8",7);
    lVar2 = local_10;
    uVar1 = local_28;
    local_40 = uVar4;
    local_58 = sexp_make_integer(local_10,3,0);
    sexp_env_define(lVar2,uVar1,uVar4);
    uVar4 = sexp_intern(local_10,"SEXP_S8",7);
    lVar2 = local_10;
    uVar1 = local_28;
    local_40 = uVar4;
    local_58 = sexp_make_integer(local_10,2,0);
    sexp_env_define(lVar2,uVar1,uVar4);
    uVar4 = sexp_intern(local_10,"SEXP_U1",7);
    lVar2 = local_10;
    uVar1 = local_28;
    local_40 = uVar4;
    local_58 = sexp_make_integer(local_10,1,0);
    sexp_env_define(lVar2,uVar1,uVar4);
    local_70 = (int *)sexp_define_foreign_aux
                                (local_10,local_28,"c128vector-set!",3,0,
                                 "sexp_c128vector_set_x_stub",sexp_c128vector_set_x_stub,0);
    if ((((ulong)local_70 & 3) == 0) && (*local_70 == 0x1b)) {
      local_70[10] = 0x43e;
      local_70[0xb] = 0;
      local_70[0xe] = 0x4d;
      local_70[0xf] = 0;
      local_70[0x10] = 5;
      local_70[0x11] = 0;
    }
    local_70 = (int *)sexp_define_foreign_aux
                                (local_10,local_28,"c128vector-ref",2,0,"sexp_c128vector_ref_stub",
                                 sexp_c128vector_ref_stub,0);
    if ((((ulong)local_70 & 3) == 0) && (*local_70 == 0x1b)) {
      local_70[10] = 1;
      local_70[0xb] = 0;
      local_70[0xe] = 0x4d;
      local_70[0xf] = 0;
      local_70[0x10] = 5;
      local_70[0x11] = 0;
    }
    local_70 = (int *)sexp_define_foreign_aux
                                (local_10,local_28,"c64vector-set!",3,0,"sexp_c64vector_set_x_stub",
                                 sexp_c64vector_set_x_stub,0);
    if ((((ulong)local_70 & 3) == 0) && (*local_70 == 0x1b)) {
      local_70[10] = 0x43e;
      local_70[0xb] = 0;
      local_70[0xe] = 0x4d;
      local_70[0xf] = 0;
      local_70[0x10] = 5;
      local_70[0x11] = 0;
    }
    local_70 = (int *)sexp_define_foreign_aux
                                (local_10,local_28,"c64vector-ref",2,0,"sexp_c64vector_ref_stub",
                                 sexp_c64vector_ref_stub,0);
    if ((((ulong)local_70 & 3) == 0) && (*local_70 == 0x1b)) {
      local_70[10] = 1;
      local_70[0xb] = 0;
      local_70[0xe] = 0x4d;
      local_70[0xf] = 0;
      local_70[0x10] = 5;
      local_70[0x11] = 0;
    }
    local_70 = (int *)sexp_define_foreign_aux
                                (local_10,local_28,"f64vector-set!",3,0,"sexp_f64vector_set_x_stub",
                                 sexp_f64vector_set_x_stub,0);
    if ((((ulong)local_70 & 3) == 0) && (*local_70 == 0x1b)) {
      local_70[10] = 0x43e;
      local_70[0xb] = 0;
      local_70[0xc] = 0x4d;
      local_70[0xd] = 0;
      local_70[0xe] = 5;
      local_70[0xf] = 0;
      local_70[0x10] = 0x17;
      local_70[0x11] = 0;
    }
    local_70 = (int *)sexp_define_foreign_aux
                                (local_10,local_28,"f64vector-ref",2,0,"sexp_f64vector_ref_stub",
                                 sexp_f64vector_ref_stub,0);
    if ((((ulong)local_70 & 3) == 0) && (*local_70 == 0x1b)) {
      local_70[10] = 0x17;
      local_70[0xb] = 0;
      local_70[0xc] = 0x4d;
      local_70[0xd] = 0;
      local_70[0xe] = 5;
      local_70[0xf] = 0;
    }
    local_70 = (int *)sexp_define_foreign_aux
                                (local_10,local_28,"f32vector-set!",3,0,"sexp_f32vector_set_x_stub",
                                 sexp_f32vector_set_x_stub,0);
    if ((((ulong)local_70 & 3) == 0) && (*local_70 == 0x1b)) {
      local_70[10] = 0x43e;
      local_70[0xb] = 0;
      local_70[0xc] = 0x4d;
      local_70[0xd] = 0;
      local_70[0xe] = 5;
      local_70[0xf] = 0;
      local_70[0x10] = 0x17;
      local_70[0x11] = 0;
    }
    local_70 = (int *)sexp_define_foreign_aux
                                (local_10,local_28,"f32vector-ref",2,0,"sexp_f32vector_ref_stub",
                                 sexp_f32vector_ref_stub,0);
    if ((((ulong)local_70 & 3) == 0) && (*local_70 == 0x1b)) {
      local_70[10] = 0x17;
      local_70[0xb] = 0;
      local_70[0xc] = 0x4d;
      local_70[0xd] = 0;
      local_70[0xe] = 5;
      local_70[0xf] = 0;
    }
    local_70 = (int *)sexp_define_foreign_aux
                                (local_10,local_28,"f16vector-set!",3,0,"sexp_f16vector_set_x_stub",
                                 sexp_f16vector_set_x_stub,0);
    if ((((ulong)local_70 & 3) == 0) && (*local_70 == 0x1b)) {
      local_70[10] = 0x43e;
      local_70[0xb] = 0;
      local_70[0xc] = 0x4d;
      local_70[0xd] = 0;
      local_70[0xe] = 5;
      local_70[0xf] = 0;
      local_70[0x10] = 0x17;
      local_70[0x11] = 0;
    }
    local_70 = (int *)sexp_define_foreign_aux
                                (local_10,local_28,"f16vector-ref",2,0,"sexp_f16vector_ref_stub",
                                 sexp_f16vector_ref_stub,0);
    if ((((ulong)local_70 & 3) == 0) && (*local_70 == 0x1b)) {
      local_70[10] = 0x17;
      local_70[0xb] = 0;
      local_70[0xc] = 0x4d;
      local_70[0xd] = 0;
      local_70[0xe] = 5;
      local_70[0xf] = 0;
    }
    local_70 = (int *)sexp_define_foreign_aux
                                (local_10,local_28,"f8vector-set!",3,0,"sexp_f8vector_set_x_stub",
                                 sexp_f8vector_set_x_stub,0);
    if ((((ulong)local_70 & 3) == 0) && (*local_70 == 0x1b)) {
      local_70[10] = 0x43e;
      local_70[0xb] = 0;
      local_70[0xc] = 0x4d;
      local_70[0xd] = 0;
      local_70[0xe] = 5;
      local_70[0xf] = 0;
      local_70[0x10] = 0x17;
      local_70[0x11] = 0;
    }
    local_70 = (int *)sexp_define_foreign_aux
                                (local_10,local_28,"f8vector-ref",2,0,"sexp_f8vector_ref_stub",
                                 sexp_f8vector_ref_stub,0);
    if ((((ulong)local_70 & 3) == 0) && (*local_70 == 0x1b)) {
      local_70[10] = 0x17;
      local_70[0xb] = 0;
      local_70[0xc] = 0x4d;
      local_70[0xd] = 0;
      local_70[0xe] = 5;
      local_70[0xf] = 0;
    }
    local_70 = (int *)sexp_define_foreign_aux
                                (local_10,local_28,"s64vector-set!",3,0,"sexp_s64vector_set_x_stub",
                                 sexp_s64vector_set_x_stub,0);
    if ((((ulong)local_70 & 3) == 0) && (*local_70 == 0x1b)) {
      local_70[10] = 0x43e;
      local_70[0xb] = 0;
      local_70[0xc] = 0x4d;
      local_70[0xd] = 0;
      local_70[0xe] = 5;
      local_70[0xf] = 0;
      local_70[0x10] = 5;
      local_70[0x11] = 0;
    }
    local_70 = (int *)sexp_define_foreign_aux
                                (local_10,local_28,"s64vector-ref",2,0,"sexp_s64vector_ref_stub",
                                 sexp_s64vector_ref_stub,0);
    if ((((ulong)local_70 & 3) == 0) && (*local_70 == 0x1b)) {
      local_70[10] = 5;
      local_70[0xb] = 0;
      local_70[0xc] = 0x4d;
      local_70[0xd] = 0;
      local_70[0xe] = 5;
      local_70[0xf] = 0;
    }
    local_70 = (int *)sexp_define_foreign_aux
                                (local_10,local_28,"u64vector-set!",3,0,"sexp_u64vector_set_x_stub",
                                 sexp_u64vector_set_x_stub,0);
    if ((((ulong)local_70 & 3) == 0) && (*local_70 == 0x1b)) {
      local_70[10] = 0x43e;
      local_70[0xb] = 0;
      local_70[0xc] = 0x4d;
      local_70[0xd] = 0;
      local_70[0xe] = 5;
      local_70[0xf] = 0;
      local_70[0x10] = 5;
      local_70[0x11] = 0;
    }
    local_70 = (int *)sexp_define_foreign_aux
                                (local_10,local_28,"u64vector-ref",2,0,"sexp_u64vector_ref_stub",
                                 sexp_u64vector_ref_stub,0);
    if ((((ulong)local_70 & 3) == 0) && (*local_70 == 0x1b)) {
      local_70[10] = 5;
      local_70[0xb] = 0;
      local_70[0xc] = 0x4d;
      local_70[0xd] = 0;
      local_70[0xe] = 5;
      local_70[0xf] = 0;
    }
    local_70 = (int *)sexp_define_foreign_aux
                                (local_10,local_28,"s32vector-set!",3,0,"sexp_s32vector_set_x_stub",
                                 sexp_s32vector_set_x_stub,0);
    if ((((ulong)local_70 & 3) == 0) && (*local_70 == 0x1b)) {
      local_70[10] = 0x43e;
      local_70[0xb] = 0;
      local_70[0xc] = 0x4d;
      local_70[0xd] = 0;
      local_70[0xe] = 5;
      local_70[0xf] = 0;
      local_70[0x10] = 5;
      local_70[0x11] = 0;
    }
    local_70 = (int *)sexp_define_foreign_aux
                                (local_10,local_28,"s32vector-ref",2,0,"sexp_s32vector_ref_stub",
                                 sexp_s32vector_ref_stub,0);
    if ((((ulong)local_70 & 3) == 0) && (*local_70 == 0x1b)) {
      local_70[10] = 5;
      local_70[0xb] = 0;
      local_70[0xc] = 0x4d;
      local_70[0xd] = 0;
      local_70[0xe] = 5;
      local_70[0xf] = 0;
    }
    local_70 = (int *)sexp_define_foreign_aux
                                (local_10,local_28,"u32vector-set!",3,0,"sexp_u32vector_set_x_stub",
                                 sexp_u32vector_set_x_stub,0);
    if ((((ulong)local_70 & 3) == 0) && (*local_70 == 0x1b)) {
      local_70[10] = 0x43e;
      local_70[0xb] = 0;
      local_70[0xc] = 0x4d;
      local_70[0xd] = 0;
      local_70[0xe] = 5;
      local_70[0xf] = 0;
      local_70[0x10] = 5;
      local_70[0x11] = 0;
    }
    local_70 = (int *)sexp_define_foreign_aux
                                (local_10,local_28,"u32vector-ref",2,0,"sexp_u32vector_ref_stub",
                                 sexp_u32vector_ref_stub,0);
    if ((((ulong)local_70 & 3) == 0) && (*local_70 == 0x1b)) {
      local_70[10] = 5;
      local_70[0xb] = 0;
      local_70[0xc] = 0x4d;
      local_70[0xd] = 0;
      local_70[0xe] = 5;
      local_70[0xf] = 0;
    }
    local_70 = (int *)sexp_define_foreign_aux
                                (local_10,local_28,"s16vector-set!",3,0,"sexp_s16vector_set_x_stub",
                                 sexp_s16vector_set_x_stub,0);
    if ((((ulong)local_70 & 3) == 0) && (*local_70 == 0x1b)) {
      local_70[10] = 0x43e;
      local_70[0xb] = 0;
      local_70[0xc] = 0x4d;
      local_70[0xd] = 0;
      local_70[0xe] = 5;
      local_70[0xf] = 0;
      local_70[0x10] = 5;
      local_70[0x11] = 0;
    }
    local_70 = (int *)sexp_define_foreign_aux
                                (local_10,local_28,"s16vector-ref",2,0,"sexp_s16vector_ref_stub",
                                 sexp_s16vector_ref_stub,0);
    if ((((ulong)local_70 & 3) == 0) && (*local_70 == 0x1b)) {
      local_70[10] = 5;
      local_70[0xb] = 0;
      local_70[0xc] = 0x4d;
      local_70[0xd] = 0;
      local_70[0xe] = 5;
      local_70[0xf] = 0;
    }
    local_70 = (int *)sexp_define_foreign_aux
                                (local_10,local_28,"u16vector-set!",3,0,"sexp_u16vector_set_x_stub",
                                 sexp_u16vector_set_x_stub,0);
    if ((((ulong)local_70 & 3) == 0) && (*local_70 == 0x1b)) {
      local_70[10] = 0x43e;
      local_70[0xb] = 0;
      local_70[0xc] = 0x4d;
      local_70[0xd] = 0;
      local_70[0xe] = 5;
      local_70[0xf] = 0;
      local_70[0x10] = 5;
      local_70[0x11] = 0;
    }
    local_70 = (int *)sexp_define_foreign_aux
                                (local_10,local_28,"u16vector-ref",2,0,"sexp_u16vector_ref_stub",
                                 sexp_u16vector_ref_stub,0);
    if ((((ulong)local_70 & 3) == 0) && (*local_70 == 0x1b)) {
      local_70[10] = 5;
      local_70[0xb] = 0;
      local_70[0xc] = 0x4d;
      local_70[0xd] = 0;
      local_70[0xe] = 5;
      local_70[0xf] = 0;
    }
    local_70 = (int *)sexp_define_foreign_aux
                                (local_10,local_28,"s8vector-set!",3,0,"sexp_s8vector_set_x_stub",
                                 sexp_s8vector_set_x_stub,0);
    if ((((ulong)local_70 & 3) == 0) && (*local_70 == 0x1b)) {
      local_70[10] = 0x43e;
      local_70[0xb] = 0;
      local_70[0xc] = 0x4d;
      local_70[0xd] = 0;
      local_70[0xe] = 5;
      local_70[0xf] = 0;
      local_70[0x10] = 5;
      local_70[0x11] = 0;
    }
    local_70 = (int *)sexp_define_foreign_aux
                                (local_10,local_28,"s8vector-ref",2,0,"sexp_s8vector_ref_stub",
                                 sexp_s8vector_ref_stub,0);
    if ((((ulong)local_70 & 3) == 0) && (*local_70 == 0x1b)) {
      local_70[10] = 5;
      local_70[0xb] = 0;
      local_70[0xc] = 0x4d;
      local_70[0xd] = 0;
      local_70[0xe] = 5;
      local_70[0xf] = 0;
    }
    local_70 = (int *)sexp_define_foreign_aux
                                (local_10,local_28,"u1vector-set!",3,0,"sexp_u1vector_set_x_stub",
                                 sexp_u1vector_set_x_stub,0);
    if ((((ulong)local_70 & 3) == 0) && (*local_70 == 0x1b)) {
      local_70[10] = 0x43e;
      local_70[0xb] = 0;
      local_70[0xe] = 5;
      local_70[0xf] = 0;
      local_70[0x10] = 5;
      local_70[0x11] = 0;
    }
    local_70 = (int *)sexp_define_foreign_aux
                                (local_10,local_28,"u1vector-ref",2,0,"sexp_u1vector_ref_stub",
                                 sexp_u1vector_ref_stub,0);
    if ((((ulong)local_70 & 3) == 0) && (*local_70 == 0x1b)) {
      local_70[10] = 5;
      local_70[0xb] = 0;
      local_70[0xe] = 5;
      local_70[0xf] = 0;
    }
    local_70 = (int *)sexp_define_foreign_aux
                                (local_10,local_28,"c128vector?",1,0,"sexp_c128vector_p_stub",
                                 sexp_c128vector_p_stub,0);
    if ((((ulong)local_70 & 3) == 0) && (*local_70 == 0x1b)) {
      local_70[10] = 0xb;
      local_70[0xb] = 0;
      local_70[0xe] = 5;
      local_70[0xf] = 0;
    }
    local_70 = (int *)sexp_define_foreign_aux
                                (local_10,local_28,"c64vector?",1,0,"sexp_c64vector_p_stub",
                                 sexp_c64vector_p_stub,0);
    if ((((ulong)local_70 & 3) == 0) && (*local_70 == 0x1b)) {
      local_70[10] = 0xb;
      local_70[0xb] = 0;
      local_70[0xe] = 5;
      local_70[0xf] = 0;
    }
    local_70 = (int *)sexp_define_foreign_aux
                                (local_10,local_28,"f64vector?",1,0,"sexp_f64vector_p_stub",
                                 sexp_f64vector_p_stub,0);
    if ((((ulong)local_70 & 3) == 0) && (*local_70 == 0x1b)) {
      local_70[10] = 0xb;
      local_70[0xb] = 0;
      local_70[0xe] = 5;
      local_70[0xf] = 0;
    }
    local_70 = (int *)sexp_define_foreign_aux
                                (local_10,local_28,"f32vector?",1,0,"sexp_f32vector_p_stub",
                                 sexp_f32vector_p_stub,0);
    if ((((ulong)local_70 & 3) == 0) && (*local_70 == 0x1b)) {
      local_70[10] = 0xb;
      local_70[0xb] = 0;
      local_70[0xe] = 5;
      local_70[0xf] = 0;
    }
    local_70 = (int *)sexp_define_foreign_aux
                                (local_10,local_28,"f16vector?",1,0,"sexp_f16vector_p_stub",
                                 sexp_f16vector_p_stub,0);
    if ((((ulong)local_70 & 3) == 0) && (*local_70 == 0x1b)) {
      local_70[10] = 0xb;
      local_70[0xb] = 0;
      local_70[0xe] = 5;
      local_70[0xf] = 0;
    }
    local_70 = (int *)sexp_define_foreign_aux
                                (local_10,local_28,"f8vector?",1,0,"sexp_f8vector_p_stub",
                                 sexp_f8vector_p_stub,0);
    if ((((ulong)local_70 & 3) == 0) && (*local_70 == 0x1b)) {
      local_70[10] = 0xb;
      local_70[0xb] = 0;
      local_70[0xe] = 5;
      local_70[0xf] = 0;
    }
    local_70 = (int *)sexp_define_foreign_aux
                                (local_10,local_28,"s64vector?",1,0,"sexp_s64vector_p_stub",
                                 sexp_s64vector_p_stub,0);
    if ((((ulong)local_70 & 3) == 0) && (*local_70 == 0x1b)) {
      local_70[10] = 0xb;
      local_70[0xb] = 0;
      local_70[0xe] = 5;
      local_70[0xf] = 0;
    }
    local_70 = (int *)sexp_define_foreign_aux
                                (local_10,local_28,"u64vector?",1,0,"sexp_u64vector_p_stub",
                                 sexp_u64vector_p_stub,0);
    if ((((ulong)local_70 & 3) == 0) && (*local_70 == 0x1b)) {
      local_70[10] = 0xb;
      local_70[0xb] = 0;
      local_70[0xe] = 5;
      local_70[0xf] = 0;
    }
    local_70 = (int *)sexp_define_foreign_aux
                                (local_10,local_28,"s32vector?",1,0,"sexp_s32vector_p_stub",
                                 sexp_s32vector_p_stub,0);
    if ((((ulong)local_70 & 3) == 0) && (*local_70 == 0x1b)) {
      local_70[10] = 0xb;
      local_70[0xb] = 0;
      local_70[0xe] = 5;
      local_70[0xf] = 0;
    }
    local_70 = (int *)sexp_define_foreign_aux
                                (local_10,local_28,"u32vector?",1,0,"sexp_u32vector_p_stub",
                                 sexp_u32vector_p_stub,0);
    if ((((ulong)local_70 & 3) == 0) && (*local_70 == 0x1b)) {
      local_70[10] = 0xb;
      local_70[0xb] = 0;
      local_70[0xe] = 5;
      local_70[0xf] = 0;
    }
    local_70 = (int *)sexp_define_foreign_aux
                                (local_10,local_28,"s16vector?",1,0,"sexp_s16vector_p_stub",
                                 sexp_s16vector_p_stub,0);
    if ((((ulong)local_70 & 3) == 0) && (*local_70 == 0x1b)) {
      local_70[10] = 0xb;
      local_70[0xb] = 0;
      local_70[0xe] = 5;
      local_70[0xf] = 0;
    }
    local_70 = (int *)sexp_define_foreign_aux
                                (local_10,local_28,"u16vector?",1,0,"sexp_u16vector_p_stub",
                                 sexp_u16vector_p_stub,0);
    if ((((ulong)local_70 & 3) == 0) && (*local_70 == 0x1b)) {
      local_70[10] = 0xb;
      local_70[0xb] = 0;
      local_70[0xe] = 5;
      local_70[0xf] = 0;
    }
    local_70 = (int *)sexp_define_foreign_aux
                                (local_10,local_28,"s8vector?",1,0,"sexp_s8vector_p_stub",
                                 sexp_s8vector_p_stub,0);
    if ((((ulong)local_70 & 3) == 0) && (*local_70 == 0x1b)) {
      local_70[10] = 0xb;
      local_70[0xb] = 0;
      local_70[0xe] = 5;
      local_70[0xf] = 0;
    }
    local_70 = (int *)sexp_define_foreign_aux
                                (local_10,local_28,"u1vector?",1,0,"sexp_u1vector_p_stub",
                                 sexp_u1vector_p_stub,0);
    if ((((ulong)local_70 & 3) == 0) && (*local_70 == 0x1b)) {
      local_70[10] = 0xb;
      local_70[0xb] = 0;
      local_70[0xe] = 5;
      local_70[0xf] = 0;
    }
    piVar5 = (int *)sexp_define_foreign_aux
                              (local_10,local_28,"uvector-length",1,0,"sexp_uvector_length_stub",
                               sexp_uvector_length_stub,0);
    if ((((ulong)piVar5 & 3) == 0) && (*piVar5 == 0x1b)) {
      piVar5[10] = 5;
      piVar5[0xb] = 0;
    }
    *(undefined8 *)(local_10 + 0x6080) = local_48;
    return (sexp_conflict)0x43e;
  }
  return (sexp_conflict)0xb3e;
}

Assistant:

sexp sexp_init_library (sexp ctx, sexp self, sexp_sint_t n, sexp env, const char* version, const sexp_abi_identifier_t abi) {
  sexp_gc_var3(name, tmp, op);
  if (!(sexp_version_compatible(ctx, version, sexp_version)
        && sexp_abi_compatible(ctx, abi, SEXP_ABI_IDENTIFIER)))
    return SEXP_ABI_ERROR;
  sexp_gc_preserve3(ctx, name, tmp, op);
  name = sexp_intern(ctx, "SEXP_F16", 8);
  sexp_env_define(ctx, env, name, tmp=sexp_make_integer(ctx, SEXP_F16));
  name = sexp_intern(ctx, "SEXP_F8", 7);
  sexp_env_define(ctx, env, name, tmp=sexp_make_integer(ctx, SEXP_F8));
  name = sexp_intern(ctx, "SEXP_C128", 9);
  sexp_env_define(ctx, env, name, tmp=sexp_make_integer(ctx, SEXP_C128));
  name = sexp_intern(ctx, "SEXP_C64", 8);
  sexp_env_define(ctx, env, name, tmp=sexp_make_integer(ctx, SEXP_C64));
  name = sexp_intern(ctx, "SEXP_F64", 8);
  sexp_env_define(ctx, env, name, tmp=sexp_make_integer(ctx, SEXP_F64));
  name = sexp_intern(ctx, "SEXP_F32", 8);
  sexp_env_define(ctx, env, name, tmp=sexp_make_integer(ctx, SEXP_F32));
  name = sexp_intern(ctx, "SEXP_U64", 8);
  sexp_env_define(ctx, env, name, tmp=sexp_make_integer(ctx, SEXP_U64));
  name = sexp_intern(ctx, "SEXP_S64", 8);
  sexp_env_define(ctx, env, name, tmp=sexp_make_integer(ctx, SEXP_S64));
  name = sexp_intern(ctx, "SEXP_U32", 8);
  sexp_env_define(ctx, env, name, tmp=sexp_make_integer(ctx, SEXP_U32));
  name = sexp_intern(ctx, "SEXP_S32", 8);
  sexp_env_define(ctx, env, name, tmp=sexp_make_integer(ctx, SEXP_S32));
  name = sexp_intern(ctx, "SEXP_U16", 8);
  sexp_env_define(ctx, env, name, tmp=sexp_make_integer(ctx, SEXP_U16));
  name = sexp_intern(ctx, "SEXP_S16", 8);
  sexp_env_define(ctx, env, name, tmp=sexp_make_integer(ctx, SEXP_S16));
  name = sexp_intern(ctx, "SEXP_U8", 7);
  sexp_env_define(ctx, env, name, tmp=sexp_make_integer(ctx, SEXP_U8));
  name = sexp_intern(ctx, "SEXP_S8", 7);
  sexp_env_define(ctx, env, name, tmp=sexp_make_integer(ctx, SEXP_S8));
  name = sexp_intern(ctx, "SEXP_U1", 7);
  sexp_env_define(ctx, env, name, tmp=sexp_make_integer(ctx, SEXP_U1));
  op = sexp_define_foreign(ctx, env, "c128vector-set!", 3, sexp_c128vector_set_x_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = SEXP_VOID;
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_UNIFORM_VECTOR);
    sexp_opcode_arg3_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "c128vector-ref", 2, sexp_c128vector_ref_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_OBJECT);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_UNIFORM_VECTOR);
    sexp_opcode_arg3_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "c64vector-set!", 3, sexp_c64vector_set_x_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = SEXP_VOID;
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_UNIFORM_VECTOR);
    sexp_opcode_arg3_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "c64vector-ref", 2, sexp_c64vector_ref_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_OBJECT);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_UNIFORM_VECTOR);
    sexp_opcode_arg3_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "f64vector-set!", 3, sexp_f64vector_set_x_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = SEXP_VOID;
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_UNIFORM_VECTOR);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg3_type(op) = sexp_make_fixnum(SEXP_FLONUM);
  }
  op = sexp_define_foreign(ctx, env, "f64vector-ref", 2, sexp_f64vector_ref_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FLONUM);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_UNIFORM_VECTOR);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "f32vector-set!", 3, sexp_f32vector_set_x_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = SEXP_VOID;
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_UNIFORM_VECTOR);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg3_type(op) = sexp_make_fixnum(SEXP_FLONUM);
  }
  op = sexp_define_foreign(ctx, env, "f32vector-ref", 2, sexp_f32vector_ref_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FLONUM);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_UNIFORM_VECTOR);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "f16vector-set!", 3, sexp_f16vector_set_x_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = SEXP_VOID;
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_UNIFORM_VECTOR);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg3_type(op) = sexp_make_fixnum(SEXP_FLONUM);
  }
  op = sexp_define_foreign(ctx, env, "f16vector-ref", 2, sexp_f16vector_ref_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FLONUM);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_UNIFORM_VECTOR);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "f8vector-set!", 3, sexp_f8vector_set_x_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = SEXP_VOID;
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_UNIFORM_VECTOR);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg3_type(op) = sexp_make_fixnum(SEXP_FLONUM);
  }
  op = sexp_define_foreign(ctx, env, "f8vector-ref", 2, sexp_f8vector_ref_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FLONUM);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_UNIFORM_VECTOR);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "s64vector-set!", 3, sexp_s64vector_set_x_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = SEXP_VOID;
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_UNIFORM_VECTOR);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg3_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "s64vector-ref", 2, sexp_s64vector_ref_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_UNIFORM_VECTOR);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "u64vector-set!", 3, sexp_u64vector_set_x_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = SEXP_VOID;
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_UNIFORM_VECTOR);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg3_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "u64vector-ref", 2, sexp_u64vector_ref_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_UNIFORM_VECTOR);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "s32vector-set!", 3, sexp_s32vector_set_x_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = SEXP_VOID;
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_UNIFORM_VECTOR);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg3_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "s32vector-ref", 2, sexp_s32vector_ref_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_UNIFORM_VECTOR);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "u32vector-set!", 3, sexp_u32vector_set_x_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = SEXP_VOID;
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_UNIFORM_VECTOR);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg3_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "u32vector-ref", 2, sexp_u32vector_ref_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_UNIFORM_VECTOR);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "s16vector-set!", 3, sexp_s16vector_set_x_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = SEXP_VOID;
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_UNIFORM_VECTOR);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg3_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "s16vector-ref", 2, sexp_s16vector_ref_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_UNIFORM_VECTOR);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "u16vector-set!", 3, sexp_u16vector_set_x_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = SEXP_VOID;
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_UNIFORM_VECTOR);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg3_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "u16vector-ref", 2, sexp_u16vector_ref_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_UNIFORM_VECTOR);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "s8vector-set!", 3, sexp_s8vector_set_x_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = SEXP_VOID;
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_UNIFORM_VECTOR);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg3_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "s8vector-ref", 2, sexp_s8vector_ref_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_UNIFORM_VECTOR);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "u1vector-set!", 3, sexp_u1vector_set_x_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = SEXP_VOID;
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg3_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "u1vector-ref", 2, sexp_u1vector_ref_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "c128vector?", 1, sexp_c128vector_p_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_BOOLEAN);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "c64vector?", 1, sexp_c64vector_p_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_BOOLEAN);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "f64vector?", 1, sexp_f64vector_p_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_BOOLEAN);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "f32vector?", 1, sexp_f32vector_p_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_BOOLEAN);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "f16vector?", 1, sexp_f16vector_p_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_BOOLEAN);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "f8vector?", 1, sexp_f8vector_p_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_BOOLEAN);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "s64vector?", 1, sexp_s64vector_p_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_BOOLEAN);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "u64vector?", 1, sexp_u64vector_p_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_BOOLEAN);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "s32vector?", 1, sexp_s32vector_p_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_BOOLEAN);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "u32vector?", 1, sexp_u32vector_p_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_BOOLEAN);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "s16vector?", 1, sexp_s16vector_p_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_BOOLEAN);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "u16vector?", 1, sexp_u16vector_p_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_BOOLEAN);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "s8vector?", 1, sexp_s8vector_p_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_BOOLEAN);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "u1vector?", 1, sexp_u1vector_p_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_BOOLEAN);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "uvector-length", 1, sexp_uvector_length_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  sexp_gc_release3(ctx);
  return SEXP_VOID;
}